

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSphereShape.cpp
# Opt level: O3

void __thiscall
btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btMultiSphereShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btVector3 *pbVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  uint uVar16;
  btVector3 *pbVar17;
  float extraout_XMM0_Da;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  btVector3 temp [128];
  ulong local_8a0;
  float local_838 [2];
  undefined8 local_830 [256];
  btScalar bVar22;
  
  if (0 < numVectors) {
    local_8a0 = 0;
    do {
      iVar5 = (this->m_localPositionArray).m_size;
      uVar9 = (ulong)iVar5;
      if (0 < (long)uVar9) {
        pbVar1 = vectors + local_8a0;
        pbVar17 = (this->m_localPositionArray).m_data;
        pfVar15 = (this->m_radiArray).m_data;
        iVar11 = 0;
        fVar20 = -1e+18;
        do {
          uVar14 = 0x80;
          if ((long)uVar9 < 0x80) {
            uVar14 = uVar9;
          }
          uVar16 = 0x80;
          if ((int)(uint)uVar9 < 0x80) {
            uVar16 = (uint)uVar9;
          }
          if ((int)uVar16 < 2) {
            uVar16 = 1;
          }
          lVar7 = -1;
          if (iVar11 < iVar5) {
            fVar18 = (float)*(undefined8 *)pbVar1->m_floats;
            fVar19 = (float)((ulong)*(undefined8 *)pbVar1->m_floats >> 0x20);
            bVar22 = pbVar1->m_floats[2];
            lVar7 = 0;
            do {
              lVar13 = lVar7;
              fVar21 = bVar22 * *(float *)&(this->super_btConvexInternalAabbCachingShape).
                                           super_btConvexInternalShape.field_0x24;
              fVar2 = *pfVar15;
              fVar3 = *(float *)((long)pbVar17->m_floats + lVar13 + 8);
              uVar4 = *(undefined8 *)
                       &(this->super_btConvexInternalAabbCachingShape).super_btConvexInternalShape.
                        super_btConvexShape.super_btCollisionShape.field_0x1c;
              fVar23 = (float)uVar4 * fVar18;
              fVar24 = (float)((ulong)uVar4 >> 0x20) * fVar19;
              uVar4 = *(undefined8 *)((long)pbVar17->m_floats + lVar13);
              (*(this->super_btConvexInternalAabbCachingShape).super_btConvexInternalShape.
                super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
              fVar18 = (float)*(undefined8 *)pbVar1->m_floats;
              fVar19 = (float)((ulong)*(undefined8 *)pbVar1->m_floats >> 0x20);
              bVar22 = pbVar1->m_floats[2];
              auVar6._4_4_ = ((float)((ulong)uVar4 >> 0x20) + fVar2 * fVar24) -
                             extraout_XMM0_Da * fVar19;
              auVar6._0_4_ = ((float)uVar4 + fVar2 * fVar23) - extraout_XMM0_Da * fVar18;
              auVar6._8_4_ = (fVar21 * fVar2 + fVar3) - extraout_XMM0_Da * bVar22;
              auVar6._12_4_ = 0;
              *(undefined1 (*) [16])((long)local_838 + lVar13) = auVar6;
              pfVar15 = pfVar15 + 1;
              lVar7 = lVar13 + 0x10;
            } while ((ulong)uVar16 * 0x10 != lVar13 + 0x10);
            pbVar17 = (btVector3 *)((long)pbVar17[1].m_floats + lVar13);
            if (iVar5 - iVar11 < 1) {
              fVar18 = -3.4028235e+38;
              lVar7 = -1;
            }
            else {
              uVar8 = 0xffffffff;
              pfVar10 = (float *)local_830;
              uVar12 = 0;
              fVar18 = -3.4028235e+38;
              do {
                fVar19 = *pfVar10 * pbVar1->m_floats[2] +
                         pfVar10[-2] * pbVar1->m_floats[0] + pfVar10[-1] * pbVar1->m_floats[1];
                if (fVar18 < fVar19) {
                  uVar8 = uVar12 & 0xffffffff;
                  fVar18 = fVar19;
                }
                uVar12 = uVar12 + 1;
                pfVar10 = pfVar10 + 4;
              } while (uVar14 != uVar12);
              lVar7 = (long)(int)uVar8;
            }
          }
          else {
            fVar18 = -3.4028235e+38;
          }
          if (fVar20 < fVar18) {
            uVar4 = local_830[lVar7 * 2];
            *(undefined8 *)supportVerticesOut[local_8a0].m_floats =
                 *(undefined8 *)(local_838 + lVar7 * 4);
            *(undefined8 *)(supportVerticesOut[local_8a0].m_floats + 2) = uVar4;
            fVar20 = fVar18;
          }
          iVar11 = iVar11 + 0x80;
          uVar9 = uVar9 - 0x80;
        } while (iVar11 < iVar5);
      }
      local_8a0 = local_8a0 + 1;
    } while (local_8a0 != (uint)numVectors);
  }
  return;
}

Assistant:

void	btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;

		const btVector3* pos = &m_localPositionArray[0];
		const btScalar* rad = &m_radiArray[0];
		int numSpheres = m_localPositionArray.size();

        for( int k = 0; k < numSpheres; k+= 128 )
        {
            btVector3 temp[128];
            int inner_count = MIN( numSpheres - k, 128 );
            for( long i = 0; i < inner_count; i++ )
            {
                temp[i] = (*pos) +vec*m_localScaling*(*rad) - vec * getMargin();
                pos++;
                rad++;
            }
            long i = vec.maxDot( temp, inner_count, newDot);
            if( newDot > maxDot )
            {
                maxDot = newDot;
                supportVerticesOut[j] = temp[i];
            }
        }
        
	}
}